

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

char * get_line(void)

{
  file_info *__ptr;
  int iVar1;
  ushort **ppuVar2;
  ifdef_state *piVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  char **local_b8;
  char **ps_1;
  char local_a8 [4];
  int ii;
  char var_name_1 [80];
  char *local_50;
  char *name;
  void *t_1;
  ifdef_state *n;
  char **ps;
  char *var_name;
  void *t1;
  void *t;
  int i;
  int c;
  
  do {
    while( true ) {
      while( true ) {
        while ((t._0_4_ = 0, saw_eof != '\0' ||
               (t._4_4_ = getc((FILE *)input_file->file), t._4_4_ == -1))) {
          __ptr = input_file;
          if (input_file->next == (file_info *)0x0) {
            if (line != (char *)0x0) {
              free(line);
            }
            _i = (char *)0x0;
            saw_eof = '\x01';
            line = _i;
            cptr = _i;
            return (char *)0x0;
          }
          while( true ) {
            piVar3 = ifdef;
            bVar6 = false;
            if (ifdef != (ifdef_state *)0x0) {
              bVar6 = ifdef->file == input_file;
            }
            if (!bVar6) break;
            error(ifdef->lineno,(char *)0x0,(char *)0x0,"No %%endif for %%if");
            ifdef = ifdef->next;
            free(piVar3);
          }
          fclose((FILE *)input_file->file);
          free(input_file->name);
          input_file = input_file->next;
          free(__ptr);
        }
        if ((line == (char *)0x0) || (linesize != 0x65)) {
          if (line != (char *)0x0) {
            free(line);
          }
          linesize = 0x65;
          line = (char *)malloc(0x65);
          if (line == (char *)0x0) {
            no_space();
          }
        }
        input_file->lineno = input_file->lineno + 1;
        while (line[(int)t] = (char)t._4_4_, (char)t._4_4_ != '\n') {
          iVar1 = (int)t + 1;
          if (linesize <= (int)t + 2) {
            linesize = linesize + 100;
            line = (char *)realloc(line,(ulong)(uint)linesize);
            if (line == (char *)0x0) {
              no_space();
            }
          }
          t._4_4_ = getc((FILE *)input_file->file);
          t._0_4_ = iVar1;
          if (t._4_4_ == -1) {
            t._4_4_ = 10;
            saw_eof = '\x01';
          }
        }
        line[(int)t + 1] = '\0';
        iVar1 = strncmp(line,"%ifdef ",7);
        if ((iVar1 == 0) || (iVar1 = strncmp(line,"%ifndef ",8), iVar1 == 0)) break;
        iVar1 = strncmp(line,"%endif",6);
        piVar3 = ifdef;
        if (iVar1 == 0) {
          if ((ifdef == (ifdef_state *)0x0) || (ifdef->file != input_file)) {
            error(input_file->lineno,(char *)0x0,(char *)0x0,
                  "There is no corresponding %%ifdef for %%endif");
          }
          else if (ifdef->nested == 0) {
            ifdef = ifdef->next;
            free(piVar3);
          }
          else {
            ifdef->nested = ifdef->nested + -1;
          }
        }
        else if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) {
          iVar1 = strncmp(line,"%include ",9);
          if (iVar1 == 0) {
            local_50 = line + 9;
            while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_50] & 0x2000) != 0) {
              local_50 = local_50 + 1;
            }
            t._0_4_ = 0;
            while( true ) {
              bVar6 = false;
              if (local_50[(int)t] != '\n') {
                bVar6 = local_50[(int)t] != ' ';
              }
              if (!bVar6) break;
              t._0_4_ = (int)t + 1;
            }
            local_50[(int)t] = '\0';
            read_from_file(local_50);
          }
          else {
            iVar1 = strncmp(line,"%define ",8);
            if (iVar1 != 0) {
              if (Eflag != 0) {
                printf("YPP: %s",line);
              }
              cptr = line;
              return line;
            }
            ps_1._4_4_ = 0;
            t._0_4_ = 8;
            while( true ) {
              bVar6 = false;
              if (line[(int)t] != '\n') {
                bVar6 = line[(int)t] != ' ';
              }
              if (!bVar6) break;
              local_a8[ps_1._4_4_] = line[(int)t];
              t._0_4_ = (int)t + 1;
              ps_1._4_4_ = ps_1._4_4_ + 1;
            }
            local_a8[ps_1._4_4_] = '\0';
            for (local_b8 = defd_vars; *local_b8 != (char *)0x0; local_b8 = local_b8 + 1) {
              iVar1 = strcmp(*local_b8,local_a8);
              if (iVar1 == 0) {
                error(input_file->lineno,(char *)0x0,(char *)0x0,
                      "Preprocessor variable %s already defined",local_a8);
              }
            }
            sVar4 = strlen(local_a8);
            pcVar5 = (char *)malloc((ulong)((int)sVar4 + 1));
            *local_b8 = pcVar5;
            strcpy(*local_b8,local_a8);
            local_b8[1] = (char *)0x0;
          }
        }
      }
      ps = (char **)(line + 7);
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)ps] & 0x2000) != 0) {
        ps = (char **)((long)ps + 1);
      }
      t._0_4_ = 0;
      while( true ) {
        bVar6 = false;
        if (*(char *)((long)ps + (long)(int)t) != '\n') {
          bVar6 = *(char *)((long)ps + (long)(int)t) != ' ';
        }
        if (!bVar6) break;
        t._0_4_ = (int)t + 1;
      }
      *(undefined1 *)((long)ps + (long)(int)t) = 0;
      if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) break;
      ifdef->nested = ifdef->nested + 1;
    }
    piVar3 = (ifdef_state *)allocate(0x20);
    piVar3->next = ifdef;
    piVar3->file = input_file;
    piVar3->lineno = input_file->lineno;
    piVar3->state = (uint)(line[3] != 'n');
    piVar3->nested = 0;
    ifdef = piVar3;
    for (n = (ifdef_state *)defd_vars; n->next != (ifdef_state *)0x0; n = (ifdef_state *)&n->file) {
      iVar1 = strcmp((char *)n->next,(char *)ps);
      if (iVar1 == 0) {
        piVar3->state = piVar3->state ^ 1;
        break;
      }
    }
  } while( true );
}

Assistant:

char *get_line() {
  extern int Eflag;
  int c;
  int i;

 NextLine:;
  i = 0;

  if (saw_eof || (c = getc(input_file->file)) == EOF) {

    /* end of current file */
    if (input_file->next) {
      void *t = input_file;
      while (ifdef && ifdef->file == input_file) {
	void *t1 = ifdef;
	error(ifdef->lineno, 0, 0, "No %%endif for %%if");
	ifdef = ifdef->next;
	FREE(t1); }
      fclose(input_file->file);
      FREE(input_file->name);
      input_file = input_file->next;
      FREE(t);
      goto NextLine;
    }

    if (line) FREE(line);
    saw_eof = 1;
    return line = cptr = 0;
  }
  if (line == 0 || linesize != (LINESIZE + 1)) {
    if (line) FREE(line);
    linesize = LINESIZE + 1;
    if (!(line = MALLOC(linesize))) no_space();
  }
  ++input_file->lineno;
  while ((line[i] = c) != '\n') {
    if (++i + 1 >= linesize)
      if (!(line = REALLOC(line, linesize += LINESIZE)))
	no_space();
    if ((c = getc(input_file->file)) == EOF) {
      c = '\n';
      saw_eof = 1;
    }
  }
  line[i+1] = 0;

  /* VM: process %ifdef/%ifndef line */
  if (!strncmp(&line[0], "%ifdef ", 7) || !strncmp(&line[0], "%ifndef ", 8)) {
    char *var_name = line + 7;
    char **ps;
    while (isspace(*var_name)) var_name++;
    for(i=0; var_name[i]!='\n' && var_name[i]!=' '; i++);
    var_name[i] = 0;
    if (ifdef && ifdef->state) {
      ifdef->nested++;
    } else {
      struct ifdef_state *n = NEW(struct ifdef_state);
      n->next = ifdef;
      n->file = input_file;
      n->lineno = input_file->lineno;
      n->state = line[3] != 'n';
      n->nested = 0;
      ifdef = n;
      /* Find the preprocessor variable */
      for(ps=&defd_vars[0]; *ps; ps++) {
	if(strcmp(*ps,var_name)==0) {
	  n->state ^= 1;
	  break;
	}
      }
    }
    goto NextLine;
  }

  /* VM: process %endif line */
  if(strncmp(&line[0], "%endif", 6)==0) {
    if(!ifdef || ifdef->file != input_file) {
      error(input_file->lineno, 0, 0, "There is no corresponding %%ifdef for %%endif");
    } else {
      if (ifdef->nested)
	ifdef->nested--;
      else {
	void *t = ifdef;
	ifdef = ifdef->next;
	FREE(t);
      }
    }
    goto NextLine;
  }

  /* VM: skip ordinary lines if ordered by %endif */
  if (ifdef && ifdef->state) {
    goto NextLine;
  }

  /* VM: Process %include line */
  if(strncmp(&line[0], "%include ", 9)==0) {
    char *name = line+9;
    while (isspace(*name)) name++;
    for(i=0; name[i]!='\n' && name[i]!=' '; i++);
    name[i] = 0;
    read_from_file(name);
    goto NextLine;
  }

  /* VM: process %define line */
  if(strncmp(&line[0], "%define ", 8)==0) {
    char var_name[80];
    int ii=0;
    char **ps;
    for(i=8; line[i]!='\n' && line[i]!=' '; i++, ii++) {
      var_name[ii] = line[i];
    }
    var_name[ii] = 0;
    /* Find the preprocessor variable */
    for(ps=&defd_vars[0]; *ps; ps++) {
      if(strcmp(*ps,var_name)==0) {
	error(input_file->lineno, 0, 0, "Preprocessor variable %s already defined", var_name);
      }
    }
    *ps = MALLOC(strlen(var_name)+1);
    strcpy(*ps, var_name);
    *++ps = NULL;
    goto NextLine;
  }

  if(Eflag) {
    printf("YPP: %s", line);
  }

  return cptr = line;
}